

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O0

PSymbolConstNumeric * dyn_cast<PSymbolConstNumeric>(DObject *p)

{
  bool bVar1;
  DObject *p_local;
  
  if ((p == (DObject *)0x0) ||
     (bVar1 = DObject::IsKindOf(p,PSymbolConstNumeric::RegistrationInfo.MyClass), p_local = p,
     !bVar1)) {
    p_local = (DObject *)0x0;
  }
  return (PSymbolConstNumeric *)p_local;
}

Assistant:

T *dyn_cast(DObject *p)
{
	if (p != NULL && p->IsKindOf(RUNTIME_CLASS_CASTLESS(T)))
	{
		return static_cast<T *>(p);
	}
	return NULL;
}